

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O2

ssize_t __thiscall
MTCompositedBupOutputter::write(MTCompositedBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  Size *pSVar1;
  path local_60;
  Image local_38;
  
  pSVar1 = (Size *)CONCAT44(in_register_00000034,__fd);
  local_38.size = *pSVar1;
  local_38.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)(pSVar1 + 1);
  local_38.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = *(pointer *)(pSVar1 + 2);
  local_38.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)(pSVar1 + 3);
  pSVar1[1].width = 0;
  pSVar1[1].height = 0;
  pSVar1[2].width = 0;
  pSVar1[2].height = 0;
  pSVar1[3].width = 0;
  pSVar1[3].height = 0;
  std::filesystem::__cxx11::path::path(&local_60,(path *)__buf);
  ThreadedImageSaver::enqueue(&this->writer,&local_38,&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&local_38.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  return extraout_RAX;
}

Assistant:

void write(Image& img, fs::path path) override {
		writer.enqueue(std::move(img), std::move(path));
	}